

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O0

int crl_cb(int operation,ASN1_VALUE **pval,ASN1_ITEM *it,void *exarg)

{
  stack_st_X509_EXTENSION *sk;
  X509_CRL *data;
  int iVar1;
  int iVar2;
  EVP_MD *type;
  ISSUING_DIST_POINT *pIVar3;
  AUTHORITY_KEYID *pAVar4;
  X509_EXTENSION *pXVar5;
  X509_EXTENSION *ex;
  ASN1_OBJECT *o;
  int nid;
  X509_EXTENSION *ext;
  size_t idx;
  stack_st_X509_EXTENSION *exts;
  long version;
  X509_CRL *pXStack_30;
  int i;
  X509_CRL *crl;
  void *exarg_local;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  int operation_local;
  
  pXStack_30 = (X509_CRL *)*pval;
  if (operation == 1) {
    pXStack_30->idp = (ISSUING_DIST_POINT *)0x0;
    pXStack_30->akid = (AUTHORITY_KEYID *)0x0;
    pXStack_30->flags = 0;
    pXStack_30->idp_flags = 0;
  }
  else {
    crl = (X509_CRL *)exarg;
    exarg_local = it;
    it_local = (ASN1_ITEM *)pval;
    pval_local._0_4_ = operation;
    if (operation == 3) {
      AUTHORITY_KEYID_free(pXStack_30->akid);
      ISSUING_DIST_POINT_free(pXStack_30->idp);
    }
    else if (operation == 5) {
      exts = (stack_st_X509_EXTENSION *)0x0;
      if ((pXStack_30->crl->version != (ASN1_INTEGER *)0x0) &&
         ((exts = (stack_st_X509_EXTENSION *)ASN1_INTEGER_get(pXStack_30->crl->version),
          (long)exts < 0 || (1 < (long)exts)))) {
        ERR_put_error(0xb,0,0x8c,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_crl.cc"
                      ,0x86);
        return 0;
      }
      data = pXStack_30;
      if ((exts != (stack_st_X509_EXTENSION *)0x1) &&
         (pXStack_30->crl->extensions != (stack_st_X509_EXTENSION *)0x0)) {
        ERR_put_error(0xb,0,0x8b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_crl.cc"
                      ,0x8d);
        return 0;
      }
      type = EVP_sha256();
      iVar1 = X509_CRL_digest(data,type,(uchar *)&pXStack_30->idp_reasons,(uint *)0x0);
      if (iVar1 == 0) {
        return 0;
      }
      pIVar3 = (ISSUING_DIST_POINT *)
               X509_CRL_get_ext_d2i(pXStack_30,0x302,(int *)((long)&version + 4),(int *)0x0);
      pXStack_30->idp = pIVar3;
      if (pXStack_30->idp == (ISSUING_DIST_POINT *)0x0) {
        if (version._4_4_ != -1) {
          return 0;
        }
      }
      else {
        iVar1 = setup_idp((X509_CRL *)pXStack_30,(ISSUING_DIST_POINT *)pXStack_30->idp);
        if (iVar1 == 0) {
          return 0;
        }
      }
      pAVar4 = (AUTHORITY_KEYID *)
               X509_CRL_get_ext_d2i(pXStack_30,0x5a,(int *)((long)&version + 4),(int *)0x0);
      pXStack_30->akid = pAVar4;
      if ((pXStack_30->akid == (AUTHORITY_KEYID *)0x0) && (version._4_4_ != -1)) {
        return 0;
      }
      sk = (stack_st_X509_EXTENSION *)pXStack_30->crl->extensions;
      for (ext = (X509_EXTENSION *)0x0; pXVar5 = (X509_EXTENSION *)sk_X509_EXTENSION_num(sk),
          ext < pXVar5; ext = (X509_EXTENSION *)((long)&ext->object + 1)) {
        ex = (X509_EXTENSION *)sk_X509_EXTENSION_value(sk,(size_t)ext);
        o = X509_EXTENSION_get_object(ex);
        iVar1 = OBJ_obj2nid(o);
        iVar2 = X509_EXTENSION_get_critical(ex);
        if (((iVar2 != 0) && (iVar1 != 0x302)) && (iVar1 != 0x5a)) {
          pXStack_30->flags = pXStack_30->flags | 0x200;
          break;
        }
      }
      iVar1 = crl_parse_entry_extensions((X509_CRL *)pXStack_30);
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static int crl_cb(int operation, ASN1_VALUE **pval, const ASN1_ITEM *it,
                  void *exarg) {
  X509_CRL *crl = (X509_CRL *)*pval;
  int i;

  switch (operation) {
    case ASN1_OP_NEW_POST:
      crl->idp = NULL;
      crl->akid = NULL;
      crl->flags = 0;
      crl->idp_flags = 0;
      break;

    case ASN1_OP_D2I_POST: {
      // The version must be one of v1(0) or v2(1).
      long version = X509_CRL_VERSION_1;
      if (crl->crl->version != NULL) {
        version = ASN1_INTEGER_get(crl->crl->version);
        // TODO(https://crbug.com/boringssl/364): |X509_CRL_VERSION_1|
        // should also be rejected. This means an explicitly-encoded X.509v1
        // version. v1 is DEFAULT, so DER requires it be omitted.
        if (version < X509_CRL_VERSION_1 || version > X509_CRL_VERSION_2) {
          OPENSSL_PUT_ERROR(X509, X509_R_INVALID_VERSION);
          return 0;
        }
      }

      // Per RFC 5280, section 5.1.2.1, extensions require v2.
      if (version != X509_CRL_VERSION_2 && crl->crl->extensions != NULL) {
        OPENSSL_PUT_ERROR(X509, X509_R_INVALID_FIELD_FOR_VERSION);
        return 0;
      }

      if (!X509_CRL_digest(crl, EVP_sha256(), crl->crl_hash, NULL)) {
        return 0;
      }

      crl->idp = reinterpret_cast<ISSUING_DIST_POINT *>(
          X509_CRL_get_ext_d2i(crl, NID_issuing_distribution_point, &i, NULL));
      if (crl->idp != NULL) {
        if (!setup_idp(crl, crl->idp)) {
          return 0;
        }
      } else if (i != -1) {
        return 0;
      }

      crl->akid = reinterpret_cast<AUTHORITY_KEYID *>(
          X509_CRL_get_ext_d2i(crl, NID_authority_key_identifier, &i, NULL));
      if (crl->akid == NULL && i != -1) {
        return 0;
      }

      // See if we have any unhandled critical CRL extensions and indicate
      // this in a flag. We only currently handle IDP so anything else
      // critical sets the flag. This code accesses the X509_CRL structure
      // directly: applications shouldn't do this.
      const STACK_OF(X509_EXTENSION) *exts = crl->crl->extensions;
      for (size_t idx = 0; idx < sk_X509_EXTENSION_num(exts); idx++) {
        const X509_EXTENSION *ext = sk_X509_EXTENSION_value(exts, idx);
        int nid = OBJ_obj2nid(X509_EXTENSION_get_object(ext));
        if (X509_EXTENSION_get_critical(ext)) {
          if (nid == NID_issuing_distribution_point ||
              nid == NID_authority_key_identifier) {
            continue;
          }
          crl->flags |= EXFLAG_CRITICAL;
          break;
        }
      }

      if (!crl_parse_entry_extensions(crl)) {
        return 0;
      }

      break;
    }

    case ASN1_OP_FREE_POST:
      AUTHORITY_KEYID_free(crl->akid);
      ISSUING_DIST_POINT_free(crl->idp);
      break;
  }
  return 1;
}